

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

FieldDescriptorProto *
google::protobuf::descriptor_unittest::AddExtension
          (FileDescriptorProto *file,string *extendee,string *name,int number,Label label,Type type)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *this;
  Arena *pAVar1;
  
  this = internal::RepeatedPtrFieldBase::
         Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                   (&(file->field_0)._impl_.extension_.super_RepeatedPtrFieldBase);
  *(byte *)&this->field_0 = *(byte *)&this->field_0 | 1;
  pAVar1 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar1 & 1) != 0) {
    pAVar1 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,name,pAVar1);
  (this->field_0)._impl_.number_ = number;
  *(byte *)&this->field_0 = *(byte *)&this->field_0 | 0x40;
  FieldDescriptorProto::set_label(this,label);
  FieldDescriptorProto::set_type(this,type);
  *(byte *)&this->field_0 = *(byte *)&this->field_0 | 2;
  pAVar1 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar1 & 1) != 0) {
    pAVar1 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.extendee_,extendee,pAVar1);
  return this;
}

Assistant:

FieldDescriptorProto* AddExtension(FileDescriptorProto* file,
                                   const std::string& extendee,
                                   const std::string& name, int number,
                                   FieldDescriptorProto::Label label,
                                   FieldDescriptorProto::Type type) {
  FieldDescriptorProto* result = file->add_extension();
  result->set_name(name);
  result->set_number(number);
  result->set_label(label);
  result->set_type(type);
  result->set_extendee(extendee);
  return result;
}